

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qprogressbar.cpp
# Opt level: O0

void QProgressBar::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QFlagsStorage<Qt::AlignmentFlag> *pQVar1;
  bool bVar2;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> QVar3;
  QFlagsStorage<Qt::AlignmentFlag> QVar4;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QProgressBar *_t;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  QProgressBar *in_stack_ffffffffffffff60;
  QProgressBar *in_stack_ffffffffffffff68;
  Orientation orientation;
  Alignment alignment;
  QProgressBar *in_stack_ffffffffffffff70;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_ffffffffffffff70 = (QProgressBar *)(ulong)in_EDX;
    orientation = (Orientation)((ulong)in_stack_ffffffffffffff68 >> 0x20);
    switch(in_stack_ffffffffffffff70) {
    case (QProgressBar *)0x0:
      valueChanged((QProgressBar *)0x663941,in_stack_ffffffffffffff5c);
      break;
    case (QProgressBar *)0x1:
      reset(in_stack_ffffffffffffff60);
      break;
    case (QProgressBar *)0x2:
      setRange(in_stack_ffffffffffffff60,orientation,(int)in_stack_ffffffffffffff68);
      break;
    case (QProgressBar *)0x3:
      setMinimum(in_stack_ffffffffffffff60,orientation);
      break;
    case (QProgressBar *)0x4:
      setMaximum(in_stack_ffffffffffffff60,orientation);
      break;
    case (QProgressBar *)0x5:
      setValue(in_stack_ffffffffffffff68,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
      break;
    case (QProgressBar *)0x6:
      setOrientation(in_stack_ffffffffffffff70,orientation);
    }
  }
  if ((in_ESI != 5) ||
     (bVar2 = QtMocHelpers::indexOfMethod<void(QProgressBar::*)(int)>
                        (in_RCX,(void **)valueChanged,0,0), !bVar2)) {
    if (in_ESI == 1) {
      pQVar1 = *(QFlagsStorage<Qt::AlignmentFlag> **)in_RCX;
      in_stack_ffffffffffffff68 = (QProgressBar *)(ulong)in_EDX;
      switch(in_stack_ffffffffffffff68) {
      case (QProgressBar *)0x0:
        QVar3.super_QFlagsStorage<Qt::AlignmentFlag>.i =
             (QFlagsStorage<Qt::AlignmentFlag>)minimum((QProgressBar *)0x663a61);
        pQVar1->i = (Int)QVar3.super_QFlagsStorage<Qt::AlignmentFlag>.i;
        break;
      case (QProgressBar *)0x1:
        QVar4.i = maximum((QProgressBar *)0x663a79);
        pQVar1->i = QVar4.i;
        break;
      case (QProgressBar *)0x2:
        (**(code **)(*in_RDI + 0x1a0))(local_20);
        QString::operator=((QString *)in_stack_ffffffffffffff60,
                           (QString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
        ;
        QString::~QString((QString *)0x663abc);
        break;
      case (QProgressBar *)0x3:
        QVar4.i = value((QProgressBar *)0x663acb);
        pQVar1->i = QVar4.i;
        break;
      case (QProgressBar *)0x4:
        QVar4.i = (Int)QProgressBar::alignment(in_stack_ffffffffffffff60);
        pQVar1->i = QVar4.i;
        break;
      case (QProgressBar *)0x5:
        bVar2 = isTextVisible((QProgressBar *)0x663b07);
        *(bool *)&pQVar1->i = bVar2;
        break;
      case (QProgressBar *)0x6:
        QVar4.i = QProgressBar::orientation(in_stack_ffffffffffffff60);
        pQVar1->i = QVar4.i;
        break;
      case (QProgressBar *)0x7:
        bVar2 = invertedAppearance(in_stack_ffffffffffffff60);
        *(bool *)&pQVar1->i = bVar2;
        break;
      case (QProgressBar *)0x8:
        QVar4.i = textDirection(in_stack_ffffffffffffff60);
        pQVar1->i = QVar4.i;
        break;
      case (QProgressBar *)0x9:
        format(in_stack_ffffffffffffff68);
        QString::operator=((QString *)in_stack_ffffffffffffff60,
                           (QString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
        ;
        QString::~QString((QString *)0x663b7f);
      }
    }
    if (in_ESI == 2) {
      in_stack_ffffffffffffff60 = (QProgressBar *)(ulong)in_EDX;
      bVar2 = SUB81((ulong)in_stack_ffffffffffffff68 >> 0x38,0);
      alignment.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
      super_QFlagsStorage<Qt::AlignmentFlag>.i = SUB84((ulong)in_stack_ffffffffffffff68 >> 0x20,0);
      switch(in_stack_ffffffffffffff60) {
      case (QProgressBar *)0x0:
        setMinimum(in_stack_ffffffffffffff60,
                   (int)alignment.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                        super_QFlagsStorage<Qt::AlignmentFlag>.i);
        break;
      case (QProgressBar *)0x1:
        setMaximum(in_stack_ffffffffffffff60,
                   (int)alignment.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                        super_QFlagsStorage<Qt::AlignmentFlag>.i);
        break;
      default:
        break;
      case (QProgressBar *)0x3:
        setValue(in_stack_ffffffffffffff68,0);
        break;
      case (QProgressBar *)0x4:
        setAlignment((QProgressBar *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     alignment);
        break;
      case (QProgressBar *)0x5:
        setTextVisible(in_stack_ffffffffffffff70,bVar2);
        break;
      case (QProgressBar *)0x6:
        setOrientation(in_stack_ffffffffffffff70,
                       (Orientation)
                       alignment.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                       super_QFlagsStorage<Qt::AlignmentFlag>.i);
        break;
      case (QProgressBar *)0x7:
        setInvertedAppearance(in_stack_ffffffffffffff70,bVar2);
        break;
      case (QProgressBar *)0x8:
        setTextDirection(in_stack_ffffffffffffff70,
                         (Direction)
                         alignment.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                         super_QFlagsStorage<Qt::AlignmentFlag>.i);
        break;
      case (QProgressBar *)0x9:
        setFormat(in_stack_ffffffffffffff70,(QString *)in_stack_ffffffffffffff68);
      }
    }
    if ((in_ESI == 3) && (in_EDX == 9)) {
      resetFormat(in_stack_ffffffffffffff60);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProgressBar::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QProgressBar *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->valueChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->reset(); break;
        case 2: _t->setRange((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 3: _t->setMinimum((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->setMaximum((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->setValue((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->setOrientation((*reinterpret_cast< std::add_pointer_t<Qt::Orientation>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QProgressBar::*)(int )>(_a, &QProgressBar::valueChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->minimum(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->maximum(); break;
        case 2: *reinterpret_cast<QString*>(_v) = _t->text(); break;
        case 3: *reinterpret_cast<int*>(_v) = _t->value(); break;
        case 4: *reinterpret_cast<Qt::Alignment*>(_v) = _t->alignment(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->isTextVisible(); break;
        case 6: *reinterpret_cast<Qt::Orientation*>(_v) = _t->orientation(); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->invertedAppearance(); break;
        case 8: *reinterpret_cast<Direction*>(_v) = _t->textDirection(); break;
        case 9: *reinterpret_cast<QString*>(_v) = _t->format(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setMinimum(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setMaximum(*reinterpret_cast<int*>(_v)); break;
        case 3: _t->setValue(*reinterpret_cast<int*>(_v)); break;
        case 4: _t->setAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        case 5: _t->setTextVisible(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setOrientation(*reinterpret_cast<Qt::Orientation*>(_v)); break;
        case 7: _t->setInvertedAppearance(*reinterpret_cast<bool*>(_v)); break;
        case 8: _t->setTextDirection(*reinterpret_cast<Direction*>(_v)); break;
        case 9: _t->setFormat(*reinterpret_cast<QString*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 9: _t->resetFormat(); break;
        default: break;
        }
    }
}